

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetTargetPropertiesCommand.cxx
# Opt level: O2

bool __thiscall
cmSetTargetPropertiesCommand::InitialPass
          (cmSetTargetPropertiesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  last;
  bool bVar1;
  pointer pbVar2;
  pointer pbVar3;
  long lVar4;
  long lVar5;
  pointer __lhs;
  allocator<char> local_69;
  string message;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propertyPairs;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar2 - (long)__lhs) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message,"called with incorrect number of arguments",
               (allocator<char> *)&propertyPairs);
    cmCommand::SetError(&this->super_cmCommand,&message);
    std::__cxx11::string::~string((string *)&message);
    return false;
  }
  propertyPairs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  propertyPairs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  propertyPairs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar5 = 1;
  pbVar3 = __lhs;
  for (; pbVar3 = pbVar3 + 1, __lhs != pbVar2; __lhs = __lhs + 1) {
    bVar1 = std::operator==(__lhs,"PROPERTIES");
    if (bVar1) {
      last._M_current =
           (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (((int)last._M_current - (int)pbVar3 & 0x20U) != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&message,"called with incorrect number of arguments.",&local_69);
        cmCommand::SetError(&this->super_cmCommand,&message);
        goto LAB_002844bc;
      }
      cmAppend<std::__cxx11::string,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (&propertyPairs,__lhs + 1,last);
      if (propertyPairs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          propertyPairs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar4 = 0;
        goto LAB_00284401;
      }
      break;
    }
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    lVar5 = lVar5 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&message,
             "called with illegal arguments, maybe missing a PROPERTIES specifier?",&local_69);
  cmCommand::SetError(&this->super_cmCommand,&message);
  goto LAB_002844bc;
  while( true ) {
    bVar1 = SetOneTarget((string *)
                         ((long)&(((args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar4),&propertyPairs,(this->super_cmCommand).Makefile);
    lVar4 = lVar4 + 0x20;
    if (!bVar1) break;
LAB_00284401:
    lVar5 = lVar5 + -1;
    if (lVar5 == 0) {
      bVar1 = true;
      goto LAB_002844c8;
    }
    bVar1 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,
                                (string *)
                                ((long)&(((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar4));
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&message,"can not be used on an ALIAS target.",&local_69);
      cmCommand::SetError(&this->super_cmCommand,&message);
      goto LAB_002844bc;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&message,"Can not find target to add properties to: ",&local_69);
  std::__cxx11::string::append((string *)&message);
  cmCommand::SetError(&this->super_cmCommand,&message);
LAB_002844bc:
  std::__cxx11::string::~string((string *)&message);
  bVar1 = false;
LAB_002844c8:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&propertyPairs);
  return bVar1;
}

Assistant:

bool cmSetTargetPropertiesCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // first collect up the list of files
  std::vector<std::string> propertyPairs;
  int numFiles = 0;
  std::vector<std::string>::const_iterator j;
  for (j = args.begin(); j != args.end(); ++j) {
    if (*j == "PROPERTIES") {
      // now loop through the rest of the arguments, new style
      ++j;
      if (std::distance(j, args.end()) % 2 != 0) {
        this->SetError("called with incorrect number of arguments.");
        return false;
      }
      cmAppend(propertyPairs, j, args.end());
      break;
    }
    numFiles++;
  }
  if (propertyPairs.empty()) {
    this->SetError("called with illegal arguments, maybe missing "
                   "a PROPERTIES specifier?");
    return false;
  }

  // now loop over all the targets
  int i;
  for (i = 0; i < numFiles; ++i) {
    if (this->Makefile->IsAlias(args[i])) {
      this->SetError("can not be used on an ALIAS target.");
      return false;
    }
    bool ret = cmSetTargetPropertiesCommand::SetOneTarget(
      args[i], propertyPairs, this->Makefile);
    if (!ret) {
      std::string message = "Can not find target to add properties to: ";
      message += args[i];
      this->SetError(message);
      return false;
    }
  }
  return true;
}